

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O0

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> *
Decoder::decode(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                *__return_storage_ptr__,string *msg)

{
  long lVar1;
  char *pcVar2;
  ulong uVar3;
  allocator local_a1;
  undefined1 local_a0 [8];
  string result;
  int local_60 [2];
  int errorCode;
  int local_4c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  char *local_28;
  anon_union_8_2_e5236f7f p;
  size_t size;
  string *msg_local;
  
  size = (size_t)msg;
  msg_local = &__return_storage_ptr__->first;
  lVar1 = std::__cxx11::string::size();
  p.void_ptr = (void *)(lVar1 + 1);
  local_28 = (char *)Resource_Reserve((size_t)p);
  if (local_28 == (char *)0x0) {
    std::__cxx11::string::string((string *)&local_48);
    local_4c = -1;
    std::make_pair<std::__cxx11::string,int>(__return_storage_ptr__,&local_48,&local_4c);
    std::__cxx11::string::~string((string *)&local_48);
  }
  else {
    local_60[0] = 0;
    pcVar2 = (char *)std::__cxx11::string::data();
    local_60[0] = details::decode(pcVar2,(size_t)p,local_28);
    pcVar2 = local_28;
    if (local_60[0] == 0) {
      uVar3 = (long)p.void_ptr - 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_a0,pcVar2,uVar3,&local_a1);
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
      Resource_Free(local_28);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int_&,_true>
                (__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                 local_60);
      std::__cxx11::string::~string((string *)local_a0);
    }
    else {
      Resource_Free(local_28);
      std::__cxx11::string::string((string *)(result.field_2._M_local_buf + 8));
      std::make_pair<std::__cxx11::string,int&>
                (__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (result.field_2._M_local_buf + 8),local_60);
      std::__cxx11::string::~string((string *)(result.field_2._M_local_buf + 8));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string, int> decode(const std::string& msg)
	{
		size_t size = msg.size() + 1;
		union {
			void* void_ptr;
			char* char_ptr;
		} p = { Resource_Reserve(size) };

		if (!p.void_ptr)
			return std::make_pair(std::string(), -1);

		int errorCode = 0;

		if ((errorCode = details::decode(msg.data(), size, p.char_ptr)) != 0)
		{
			Resource_Free(p.void_ptr);
			return std::make_pair(std::string(), errorCode);
		}

		std::string result(p.char_ptr, size-1);

		Resource_Free(p.void_ptr);

		return { result, errorCode };
	}